

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher.c
# Opt level: O2

int mbedtls_cipher_check_tag(mbedtls_cipher_context_t *ctx,uchar *tag,size_t tag_len)

{
  mbedtls_cipher_info_t *pmVar1;
  int iVar2;
  int iVar3;
  uchar check_tag [16];
  
  pmVar1 = ctx->cipher_info;
  if ((pmVar1 == (mbedtls_cipher_info_t *)0x0) || (ctx->operation != MBEDTLS_DECRYPT)) {
    return -0x6100;
  }
  if (pmVar1->mode == MBEDTLS_MODE_GCM) {
    if (0x10 < tag_len) {
      return -0x6100;
    }
    iVar2 = mbedtls_gcm_finish((mbedtls_gcm_context *)ctx->cipher_ctx,check_tag,tag_len);
    if (iVar2 != 0) {
      return iVar2;
    }
  }
  else {
    if (pmVar1->type != MBEDTLS_CIPHER_CHACHA20_POLY1305) {
      return 0;
    }
    if (tag_len != 0x10) {
      return -0x6100;
    }
    iVar2 = mbedtls_chachapoly_finish((mbedtls_chachapoly_context *)ctx->cipher_ctx,check_tag);
    if (iVar2 != 0) {
      return iVar2;
    }
    tag_len = 0x10;
  }
  iVar3 = mbedtls_constant_time_memcmp(tag,check_tag,tag_len);
  iVar2 = -0x6300;
  if (iVar3 == 0) {
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int mbedtls_cipher_check_tag( mbedtls_cipher_context_t *ctx,
                      const unsigned char *tag, size_t tag_len )
{
    unsigned char check_tag[16];
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;

    CIPHER_VALIDATE_RET( ctx != NULL );
    CIPHER_VALIDATE_RET( tag_len == 0 || tag != NULL );
    if( ctx->cipher_info == NULL )
        return( MBEDTLS_ERR_CIPHER_BAD_INPUT_DATA );

    if( MBEDTLS_DECRYPT != ctx->operation )
    {
        return( MBEDTLS_ERR_CIPHER_BAD_INPUT_DATA );
    }

#if defined(MBEDTLS_USE_PSA_CRYPTO)
    if( ctx->psa_enabled == 1 )
    {
        /* While PSA Crypto has an API for multipart
         * operations, we currently don't make it
         * accessible through the cipher layer. */
        return( MBEDTLS_ERR_CIPHER_FEATURE_UNAVAILABLE );
    }
#endif /* MBEDTLS_USE_PSA_CRYPTO */

#if defined(MBEDTLS_GCM_C)
    if( MBEDTLS_MODE_GCM == ctx->cipher_info->mode )
    {
        if( tag_len > sizeof( check_tag ) )
            return( MBEDTLS_ERR_CIPHER_BAD_INPUT_DATA );

        if( 0 != ( ret = mbedtls_gcm_finish(
                       (mbedtls_gcm_context *) ctx->cipher_ctx,
                       check_tag, tag_len ) ) )
        {
            return( ret );
        }

        /* Check the tag in "constant-time" */
        if( mbedtls_constant_time_memcmp( tag, check_tag, tag_len ) != 0 )
            return( MBEDTLS_ERR_CIPHER_AUTH_FAILED );

        return( 0 );
    }
#endif /* MBEDTLS_GCM_C */

#if defined(MBEDTLS_CHACHAPOLY_C)
    if ( MBEDTLS_CIPHER_CHACHA20_POLY1305 == ctx->cipher_info->type )
    {
        /* Don't allow truncated MAC for Poly1305 */
        if ( tag_len != sizeof( check_tag ) )
            return( MBEDTLS_ERR_CIPHER_BAD_INPUT_DATA );

        ret = mbedtls_chachapoly_finish(
            (mbedtls_chachapoly_context*) ctx->cipher_ctx, check_tag );
        if ( ret != 0 )
        {
            return( ret );
        }

        /* Check the tag in "constant-time" */
        if( mbedtls_constant_time_memcmp( tag, check_tag, tag_len ) != 0 )
            return( MBEDTLS_ERR_CIPHER_AUTH_FAILED );

        return( 0 );
    }
#endif /* MBEDTLS_CHACHAPOLY_C */

    return( 0 );
}